

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void kj::ArrayDisposer::Dispose_<kj::ReadableDirectory::Entry,_false>::destruct(void *ptr)

{
  long lVar1;
  undefined8 uVar2;
  
  lVar1 = *(long *)((long)ptr + 8);
  if (lVar1 != 0) {
    uVar2 = *(undefined8 *)((long)ptr + 0x10);
    *(undefined8 *)((long)ptr + 8) = 0;
    *(undefined8 *)((long)ptr + 0x10) = 0;
    (**(code **)**(undefined8 **)((long)ptr + 0x18))
              (*(undefined8 **)((long)ptr + 0x18),lVar1,1,uVar2,uVar2,0);
  }
  return;
}

Assistant:

static void destruct(void* ptr) {
    kj::dtor(*reinterpret_cast<T*>(ptr));
  }